

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void runhcmp(runcxdef *ctx,uint siz,uint below,runsdef *val1,runsdef *val2,runsdef *val3)

{
  ushort uVar1;
  ushort *puVar2;
  runsdef *prVar3;
  runsdef *prVar4;
  bool bVar5;
  ushort *__dest;
  runsdef *prVar6;
  ushort *__src;
  
  __dest = (ushort *)ctx->runcxheap;
  puVar2 = (ushort *)ctx->runcxhp;
  if (__dest < puVar2) {
    prVar3 = ctx->runcxstk;
    prVar4 = ctx->runcxsp;
    __src = __dest;
    do {
      uVar1 = *__src;
      bVar5 = false;
      if (prVar3 < prVar4 + below) {
        bVar5 = false;
        prVar6 = prVar3;
        do {
          if (((prVar6->runstyp | 4) == 7) && ((ushort *)(prVar6->runsv).runsvnum == __src)) {
            (prVar6->runsv).runsvstr = (uchar *)__dest;
            bVar5 = true;
          }
          prVar6 = prVar6 + 1;
        } while (prVar6 < prVar4 + below);
      }
      if ((val1 != (runsdef *)0x0) && ((ushort *)(val1->runsv).runsvnum == __src)) {
        (val1->runsv).runsvstr = (uchar *)__dest;
        bVar5 = true;
      }
      if ((val2 != (runsdef *)0x0) && ((ushort *)(val2->runsv).runsvnum == __src)) {
        (val2->runsv).runsvstr = (uchar *)__dest;
        bVar5 = true;
      }
      if ((val3 != (runsdef *)0x0) && ((ushort *)(val3->runsv).runsvnum == __src)) {
        (val3->runsv).runsvstr = (uchar *)__dest;
        bVar5 = true;
      }
      if (bVar5) {
        if (__src != __dest) {
          memmove(__dest,__src,(ulong)*__src);
        }
        __dest = (ushort *)((long)__dest + (ulong)*__dest);
      }
      __src = (ushort *)((long)__src + (ulong)uVar1);
    } while (__src < puVar2);
  }
  ctx->runcxhp = (uchar *)__dest;
  if ((uint)(*(int *)&ctx->runcxhtop - (int)__dest) < siz) {
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x3ea);
  }
  return;
}

Assistant:

void runhcmp(runcxdef *ctx, uint siz, uint below,
             runsdef *val1, runsdef *val2, runsdef *val3)
{
    uchar   *hp   = ctx->runcxheap;
    uchar   *htop = ctx->runcxhp;
    runsdef *stop = ctx->runcxsp + below;
    runsdef *stk  = ctx->runcxstk;
    runsdef *sp;
    uchar   *dst  = hp;
    uchar   *hnxt;
    int      ref;
    
    /* go through heap, finding references on stack */
    for ( ; hp < htop ; hp = hnxt)
    {
        hnxt = hp + osrp2(hp);                /* remember next heap element */

        for (ref = FALSE, sp = stk ; sp < stop ; ++sp)
        {
            switch(sp->runstyp)
            {
            case DAT_SSTRING:
            case DAT_LIST:
                if (sp->runsv.runsvstr == hp)    /* reference to this item? */
                {
                    ref = TRUE;             /* this heap item is referenced */
                    sp->runsv.runsvstr = dst;      /* reflect imminent move */
                }
                break;
                
            default:                /* other types do not refer to the heap */
                break;
            }
        }

        /* check the explicitly referenced value pointers as well */
#define CHECK_VAL(val) \
        if (val && val->runsv.runsvstr == hp) \
            ref = TRUE, val->runsv.runsvstr = dst;
        CHECK_VAL(val1);
        CHECK_VAL(val2);
        CHECK_VAL(val3);
#undef CHECK_VAL

        /* if referenced, copy it to dst and advance dst */
        if (ref)
        {
            if (hp != dst) memmove(dst, hp, (size_t)osrp2(hp));
            dst += osrp2(dst);
        }
    }

    /* set heap pointer based on shuffled heap */
    ctx->runcxhp = dst;
    
    /* check for space requested, and signal error if not available */
    if ((uint)(ctx->runcxhtop - ctx->runcxhp) < siz)
        runsig(ctx, ERR_HPOVF);
}